

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O1

TrackData * GenerateOperaSoftTrack(TrackData *__return_storage_ptr__,CylHead *cylhead,Track *track)

{
  pointer pSVar1;
  TrackData *pTVar2;
  bool bVar3;
  Sector *this;
  Sector *header;
  Data *data;
  BitBuffer *bitstream;
  pointer puVar4;
  pointer sector;
  BitstreamTrackBuilder bitbuf;
  Data local_d8;
  CylHead *local_c0;
  TrackData *local_b8;
  BitstreamTrackBuilder local_b0;
  
  bVar3 = IsOperaSoftTrack(track);
  if (bVar3) {
    local_c0 = cylhead;
    BitstreamTrackBuilder::BitstreamTrackBuilder(&local_b0,_250K,MFM);
    TrackBuilder::addTrackStart(&local_b0.super_TrackBuilder,false);
    sector = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_b8 = __return_storage_ptr__;
    if (sector != pSVar1) {
      do {
        if ((sector->header).sector == 8) {
          this = Track::operator[](track,7);
          header = Track::operator[](track,8);
          TrackBuilder::addSectorUpToData(&local_b0.super_TrackBuilder,&header->header,header->dam);
          local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)operator_new(0x100);
          puVar4 = local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start + 0x100;
          local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = puVar4;
          memset(local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,0x55,0x100);
          local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar4;
          TrackBuilder::addBlock(&local_b0.super_TrackBuilder,&local_d8);
          if (local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_d8.
                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_d8.
                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          BitstreamTrackBuilder::addCrc(&local_b0,0x104);
          local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)operator_new(0x410);
          puVar4 = local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start + 0x410;
          local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = puVar4;
          memset(local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,0x4e,0x410);
          local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar4;
          TrackBuilder::addBlock(&local_b0.super_TrackBuilder,&local_d8);
          if (local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_d8.
                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_d8.
                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          data = Sector::data_copy(this,0);
          TrackBuilder::addBlock(&local_b0.super_TrackBuilder,data);
        }
        else {
          TrackBuilder::addSector(&local_b0.super_TrackBuilder,sector,0xf0);
        }
        sector = sector + 1;
      } while (sector != pSVar1);
    }
    bitstream = BitstreamTrackBuilder::buffer(&local_b0);
    pTVar2 = local_b8;
    TrackData::TrackData(local_b8,local_c0,bitstream);
    if (local_b0.m_buffer.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.m_buffer.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_b0.m_buffer.m_sync_losses.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.m_buffer.m_sync_losses.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_b0.m_buffer.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.m_buffer.m_indexes.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_b0.m_buffer.m_indexes.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.m_buffer.m_indexes.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_b0.m_buffer.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.m_buffer.m_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b0.m_buffer.m_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.m_buffer.m_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return pTVar2;
  }
  __assert_fail("IsOperaSoftTrack(track)",
                "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/SpecialFormat.cpp"
                ,0x281,"TrackData GenerateOperaSoftTrack(const CylHead &, const Track &)");
}

Assistant:

TrackData GenerateOperaSoftTrack(const CylHead& cylhead, const Track& track)
{
    assert(IsOperaSoftTrack(track));

    BitstreamTrackBuilder bitbuf(DataRate::_250K, Encoding::MFM);
    bitbuf.addTrackStart();

    for (auto& sector : track)
    {
        if (sector.header.sector != 8)
            bitbuf.addSector(sector, 0xf0);
        else
        {
            auto& sector7 = track[7];
            auto& sector8 = track[8];

            bitbuf.addSectorUpToData(sector8.header, sector8.dam);
            bitbuf.addBlock(Data(256, 0x55));
            bitbuf.addCrc(4 + 256);
            bitbuf.addBlock(Data(0x512 - 256 - 2, 0x4e));
            bitbuf.addBlock(sector7.data_copy());
        }
    }

    return TrackData(cylhead, std::move(bitbuf.buffer()));
}